

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  int *piVar1;
  int iVar2;
  cmCTestTestProperties *pcVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_00;
  cmProcess *this_01;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  long *plVar10;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  long lVar11;
  char cVar12;
  char *pcVar13;
  pointer ppVar14;
  char *pcVar15;
  double dVar16;
  string oldpath;
  string reason;
  ostringstream cmCTestLog_msg_11;
  char buf [1024];
  string local_620;
  char *local_600;
  char *local_5f8;
  char local_5f0;
  undefined7 uStack_5ef;
  int local_5dc;
  undefined1 local_5d8 [16];
  _func_int *local_5c8 [12];
  ios_base local_568 [272];
  string local_458;
  undefined1 local_438 [1032];
  
  if (((this->TestHandler->MemCheck == false) &&
      (bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar5)) ||
     ((this->TestHandler->MemCheck == true &&
      (bVar5 = cmCTest::ShouldCompressMemCheckOutput(this->CTest), bVar5)))) {
    CompressOutput(this);
  }
  WriteLogOutputTop(this,completed,total);
  local_600 = &local_5f0;
  local_5f8 = (char *)0x0;
  local_5f0 = '\0';
  local_5dc = 1;
  if (started) {
    local_5dc = cmProcess::GetProcessStatus(this->TestProcess);
  }
  iVar7 = this->TestProcess->ExitValue;
  ppVar14 = (this->TestProperties->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar14 ==
      (this->TestProperties->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
  }
  else {
    for (; ppVar14 !=
           (this->TestProperties->RequiredRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
      bVar5 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar5) {
        bVar5 = false;
        std::__cxx11::string::_M_replace((ulong)&local_600,0,local_5f8,0x5a6a28);
        goto LAB_002f023d;
      }
    }
    bVar5 = true;
    std::__cxx11::string::_M_replace((ulong)&local_600,0,local_5f8,0x5a6a4b);
LAB_002f023d:
    std::__cxx11::string::append((char *)&local_600);
    ppVar14 = (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar14 !=
        (this->TestProperties->RequiredRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_600,(ulong)(ppVar14->second)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_600);
        ppVar14 = ppVar14 + 1;
      } while (ppVar14 !=
               (this->TestProperties->RequiredRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)&local_600);
  }
  ppVar14 = (this->TestProperties->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar14 !=
      (this->TestProperties->ErrorRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (; ppVar14 !=
           (this->TestProperties->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
      bVar6 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar6) {
        std::__cxx11::string::_M_replace((ulong)&local_600,0,local_5f8,0x5a6a72);
        std::__cxx11::string::append((char *)&local_600);
        std::__cxx11::string::_M_append
                  ((char *)&local_600,(ulong)(ppVar14->second)._M_dataplus._M_p);
        bVar5 = true;
        std::__cxx11::string::append((char *)&local_600);
        break;
      }
    }
  }
  if (local_5dc == 2) {
    cVar12 = this->CTest->OutputTestOutputOnTestFailure;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Exception: ",0xe);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,(char *)local_5d8._0_8_,false);
    if ((_func_int **)local_5d8._0_8_ != local_5c8) {
      operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
    iVar7 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar7) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"SegFault",8);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf3,(char *)local_5d8._0_8_,false);
      if ((_func_int **)local_5d8._0_8_ != local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Illegal",7);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf7,(char *)local_5d8._0_8_,false);
      if ((_func_int **)local_5d8._0_8_ != local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Interrupt",9);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfb,(char *)local_5d8._0_8_,false);
      if ((_func_int **)local_5d8._0_8_ != local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Numerical",9);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xff,(char *)local_5d8._0_8_,false);
      if ((_func_int **)local_5d8._0_8_ != local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Other",5);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x103,(char *)local_5d8._0_8_,false);
      if ((_func_int **)local_5d8._0_8_ != local_5c8) {
        operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
      (this->TestResult).Status = 6;
    }
    goto LAB_002f0a0c;
  }
  if (local_5dc == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Timeout ",0xb);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xe8,(char *)local_5d8._0_8_,false);
    if ((_func_int **)local_5d8._0_8_ != local_5c8) {
      operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
    (this->TestResult).Status = 1;
LAB_002f041c:
    cVar12 = this->CTest->OutputTestOutputOnTestFailure;
  }
  else {
    if (local_5dc == 4) {
      if (bVar5) {
        bVar5 = false;
      }
      else if (iVar7 == 0) {
        bVar5 = true;
      }
      else {
        bVar5 = (this->TestProperties->RequiredRegularExpressions).
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->TestProperties->RequiredRegularExpressions).
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar3 = this->TestProperties;
      if (pcVar3->SkipReturnCode == iVar7 && -1 < pcVar3->SkipReturnCode) {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Skipped ",0xb);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xd7,(char *)local_5d8._0_8_,false);
      }
      else {
        if (bVar5) {
          if (pcVar3->WillFail == true) {
            if (!bVar5) goto LAB_002f0959;
            goto LAB_002f1127;
          }
        }
        else {
LAB_002f0959:
          if (pcVar3->WillFail != true) {
LAB_002f1127:
            (this->TestResult).Status = 7;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_438,"***Failed  ",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_438,local_600,(long)local_5f8);
            pcVar4 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                         ,0xe2,(char *)local_5d8._0_8_,false);
            if ((_func_int **)local_5d8._0_8_ != local_5c8) {
              operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
            std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
            goto LAB_002f041c;
          }
        }
        (this->TestResult).Status = 9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"   Passed  ",0xb);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xdd,(char *)local_5d8._0_8_,false);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Not Run ",0xb);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x109,(char *)local_5d8._0_8_,false);
    }
    if ((_func_int **)local_5d8._0_8_ != local_5c8) {
      operator_delete((void *)local_5d8._0_8_,(ulong)(local_5c8[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
    cVar12 = '\0';
  }
LAB_002f0a0c:
  iVar7 = (this->TestResult).Status;
  sprintf(local_438,"%6.2f sec",this->TestProcess->TotalTime);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d8);
  sVar8 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d8,local_438,sVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5d8,"\n",1);
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x10f,local_620._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d8);
  std::ios_base::~ios_base(local_568);
  collapse = extraout_DL;
  if (cVar12 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5d8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5d8,(this->ProcessOutput)._M_dataplus._M_p,
                        (this->ProcessOutput)._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x113,local_620._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5d8);
    std::ios_base::~ios_base(local_568);
    collapse = extraout_DL_00;
  }
  poVar9 = this->TestHandler->LogFile;
  if (poVar9 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Test time = ",0xc);
    sVar8 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_438,sVar8);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    collapse = extraout_DL_01;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_620,(SystemTools *)&DAT_00000001,(bool)collapse);
  cmsys::SystemTools::ChangeDirectory(&this->TestProperties->Directory);
  DartProcessing(this);
  cmsys::SystemTools::ChangeDirectory(&local_620);
  if ((started) && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9]);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Reason);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar2 = (this->TestResult).Status;
    pcVar13 = "Test Pass Reason";
    pcVar15 = "Test Passed.\n";
    if ((iVar2 != 0) && (iVar2 != 9)) {
      pcVar13 = "Test Fail Reason";
      pcVar15 = "Test Failed.\n";
    }
    dVar16 = this->TestProcess->TotalTime;
    sprintf(local_5d8,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar16 / 3600.0),
            (ulong)(uint)((int)(dVar16 / 60.0) % 0x3c),(ulong)(uint)((int)dVar16 % 0x3c));
    poVar9 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    poVar9 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length == 0) {
      lVar11 = 0xd;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n",2);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(this->TestResult).Reason._M_dataplus._M_p,
                          (this->TestResult).Reason._M_string_length);
      lVar11 = 1;
      pcVar15 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,lVar11);
    poVar9 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(this->TestProperties->Name)._M_dataplus._M_p,
                        (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" end time: ",0xc);
    cmCTest::CurrentTime_abi_cxx11_(&local_458,this->CTest);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_458._M_dataplus._M_p,local_458._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(this->TestProperties->Name)._M_dataplus._M_p,
                        (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" time elapsed: ",0x10);
    sVar8 = strlen(local_5d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_5d8,sVar8);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    plVar10 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
  }
  if (started) {
    bVar5 = false;
    if ((this->TestHandler->MemCheck == false) &&
       (this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar5;
    pcVar13 = (char *)(this->TestResult).CompletionStatus._M_string_length;
    (this->TestResult).ReturnValue = this->TestProcess->ExitValue;
    std::__cxx11::string::_M_replace((ulong)&(this->TestResult).CompletionStatus,0,pcVar13,0x5a6b84)
    ;
    (this->TestResult).ExecutionTime = this->TestProcess->TotalTime;
    MemCheckPostProcess(this);
    if ((this->TestResult).Status == 9) {
      pcVar3 = this->TestProperties;
      dVar16 = (double)pcVar3->PreviousRuns;
      pcVar3->Cost = (float)(((double)pcVar3->Cost * dVar16 + (this->TestResult).ExecutionTime) /
                            (dVar16 + 1.0));
      pcVar3->PreviousRuns = pcVar3->PreviousRuns + 1;
    }
  }
  piVar1 = &this->NumberOfRunsLeft;
  *piVar1 = *piVar1 + -1;
  if (((*piVar1 == 0) || (this->RunUntilFail != true)) || ((this->TestResult).Status != 9)) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  else {
    this->RunAgain = true;
  }
  this_01 = this->TestProcess;
  if (this_01 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(this_01);
    operator_delete(this_01,0xc0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600,CONCAT71(uStack_5ef,local_5f0) + 1);
  }
  return iVar7 == 9;
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
      this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
      this->CTest->ShouldCompressMemCheckOutput()))
    {
    this->CompressOutput();
    }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res = started ? this->TestProcess->GetProcessStatus()
                    : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression,
    std::string> >::iterator passIt;
  bool forceFail = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty())
    {
    bool found = false;
    for ( passIt = this->TestProperties->RequiredRegularExpressions.begin();
          passIt != this->TestProperties->RequiredRegularExpressions.end();
          ++ passIt )
      {
      if ( passIt->first.find(this->ProcessOutput.c_str()) )
        {
        found = true;
        reason = "Required regular expression found.";
        break;
        }
      }
    if ( !found )
      {
      reason = "Required regular expression not found.";
      forceFail = true;
      }
    reason +=  "Regex=[";
    for ( passIt = this->TestProperties->RequiredRegularExpressions.begin();
          passIt != this->TestProperties->RequiredRegularExpressions.end();
          ++ passIt )
      {
      reason += passIt->second;
      reason += "\n";
      }
    reason += "]";
    }
  if (!this->TestProperties->ErrorRegularExpressions.empty())
    {
    for ( passIt = this->TestProperties->ErrorRegularExpressions.begin();
          passIt != this->TestProperties->ErrorRegularExpressions.end();
          ++ passIt )
      {
      if ( passIt->first.find(this->ProcessOutput.c_str()) )
        {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
        }
      }
    }
  if (res == cmsysProcess_State_Exited)
    {
    bool success =
      !forceFail &&  (retVal == 0 ||
      this->TestProperties->RequiredRegularExpressions.size());
    if(this->TestProperties->SkipReturnCode >= 0
      && this->TestProperties->SkipReturnCode == retVal)
      {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      }
    else if((success && !this->TestProperties->WillFail)
      || (!success && this->TestProperties->WillFail))
      {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  " );
      }
    else
      {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason );
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
      }
    }
  else if ( res == cmsysProcess_State_Expired )
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  else if ( res == cmsysProcess_State_Exception )
    {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    switch(this->TestProcess->GetExitException())
      {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Other");
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
      }
    }
  else //cmsysProcess_State_Error
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
    }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n" );

  if ( outputTestErrorsToConsole )
    {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl );
    }

  if ( this->TestHandler->LogFile )
    {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
    }

  // Set the working directory to the tests directory
  std::string oldpath = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(this->TestProperties->Directory);

  this->DartProcessing();

  // restore working directory
  cmSystemTools::ChangeDirectory(oldpath);


  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if(!this->TestHandler->MemCheck && started)
    {
    this->TestHandler->CleanTestOutput(this->ProcessOutput,
      static_cast<size_t>
      (this->TestResult.Status == cmCTestTestHandler::COMPLETED ?
      this->TestHandler->CustomMaximumPassedTestOutputSize :
      this->TestHandler->CustomMaximumFailedTestOutputSize));
    }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile)
    {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if(this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
       this->TestResult.Status != cmCTestTestHandler::NOT_RUN)
      {
      reasonType = "Test Fail Reason";
      pass = false;
      }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if(!this->TestResult.Reason.empty())
      {
      *this->TestHandler->LogFile << reasonType << ":\n"
        << this->TestResult.Reason << "\n";
      }
    else
      {
      if(pass)
        {
        *this->TestHandler->LogFile << "Test Passed.\n";
        }
      else
        {
        *this->TestHandler->LogFile << "Test Failed.\n";
        }
      }
    *this->TestHandler->LogFile << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: "
      << buffer << std::endl
      << "----------------------------------------------------------"
      << std::endl << std::endl;
    }
  // if the test actually started and ran
  // record the results in TestResult
  if(started)
    {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 &&
      this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output = compress ? this->CompressedOutput
      : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    this->TestResult.CompletionStatus = "Completed";
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
    }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if(!this->NeedsToRerun())
    {
    this->TestHandler->TestResults.push_back(this->TestResult);
    }
  delete this->TestProcess;
  return passed;
}